

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcMasterTable.cpp
# Opt level: O2

GrcMasterValueList * __thiscall GrcMasterTable::ValueListFor(GrcMasterTable *this,Symbol psym)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  Symbol local_10;
  
  local_10 = psym;
  iVar1 = std::
          _Rb_tree<GrcSymbolTableEntry_*,_std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>,_std::_Select1st<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_>,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_>_>
          ::find((_Rb_tree<GrcSymbolTableEntry_*,_std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>,_std::_Select1st<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_>,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_>_>
                  *)this,&local_10);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->m_vlistmapEntries)._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = (_Base_ptr)0x0;
  }
  else {
    p_Var2 = iVar1._M_node[1]._M_parent;
  }
  return (GrcMasterValueList *)p_Var2;
}

Assistant:

GrcMasterValueList * GrcMasterTable::ValueListFor(Symbol psym)
{
	Assert(psym->FitsSymbolType(ksymtClass) || psym->FitsSymbolType(ksymtFeature));

	GrcMasterValueList * pmvl;
	ValueListMap::iterator hmit = m_vlistmapEntries.find(psym);
	if (hmit == m_vlistmapEntries.end())
		pmvl = NULL;
	else
        pmvl = hmit->second;
	//m_vlistmapEntries.Retrieve(psym, &pmvl);
	return pmvl;
}